

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::double_writer::operator()
          (double_writer *this,truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it
          )

{
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> it_00;
  long lVar1;
  value_type *pvVar2;
  undefined8 *in_RSI;
  long *in_RDI;
  undefined8 in_stack_ffffffffffffff58;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffc9;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> local_30;
  undefined8 *local_10;
  
  local_10 = in_RSI;
  if ((char)in_RDI[1] != '\0') {
    lVar1 = in_RDI[1];
    internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>::operator++
              (in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    pvVar2 = internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>::operator*
                       (&local_30);
    *pvVar2 = (value_type)lVar1;
    *in_RDI = *in_RDI + -1;
  }
  internal::basic_buffer<char>::begin((basic_buffer<char> *)in_RDI[2]);
  internal::basic_buffer<char>::end((basic_buffer<char> *)in_RDI[2]);
  it_00.super_truncating_iterator_base<char_*>.limit_ = in_stack_ffffffffffffffb8;
  it_00.super_truncating_iterator_base<char_*>.out_ = (char *)in_stack_ffffffffffffffb0;
  it_00.super_truncating_iterator_base<char_*>.count_ = in_stack_ffffffffffffffc0;
  it_00.blackhole_ = in_stack_ffffffffffffffc8;
  it_00._25_7_ = in_stack_ffffffffffffffc9;
  internal::
  copy_str<char,char*,fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>>
            ((char *)local_10[2],(char *)local_10[1],it_00);
  *local_10 = in_stack_ffffffffffffffb0;
  local_10[1] = in_stack_ffffffffffffffb8;
  local_10[2] = in_stack_ffffffffffffffc0;
  *(undefined1 *)(local_10 + 3) = in_stack_ffffffffffffffc8;
  return;
}

Assistant:

void operator()(It &&it) {
      if (sign) {
        *it++ = static_cast<char_type>(sign);
        --n;
      }
      it = internal::copy_str<char_type>(buffer.begin(), buffer.end(), it);
    }